

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

String * doctest::detail::stringifyBinaryExpr<long_double,long_double>
                   (longdouble *lhs,char *op,longdouble *rhs)

{
  String *in_RDI;
  char *in_stack_ffffffffffffff58;
  undefined2 uVar1;
  undefined6 uStack_96;
  String *in_stack_ffffffffffffff90;
  String *in_stack_ffffffffffffff98;
  
  uVar1 = SUB82(in_RDI,0);
  uStack_96 = (undefined6)((ulong)in_RDI >> 0x10);
  doctest::toString((longdouble)CONCAT28(uVar1,in_RDI));
  String::String(in_RDI,in_stack_ffffffffffffff58);
  String::operator+(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  doctest::toString((longdouble)CONCAT28(uVar1,in_RDI));
  String::operator+(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  String::~String(in_RDI);
  String::~String(in_RDI);
  String::~String(in_RDI);
  String::~String(in_RDI);
  return (String *)CONCAT62(uStack_96,uVar1);
}

Assistant:

String stringifyBinaryExpr(const DOCTEST_REF_WRAP(L) lhs, const char* op,
                               const DOCTEST_REF_WRAP(R) rhs) {
        // NOLINTNEXTLINE(clang-analyzer-cplusplus.NewDeleteLeaks)
        return toString(lhs) + op + toString(rhs);
    }